

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
booster::locale::basic_format<wchar_t>::add(basic_format<wchar_t> *this,formattible_type *param)

{
  formattible_type *param_local;
  basic_format<wchar_t> *this_local;
  
  if (this->parameters_count_ < 8) {
    details::formattible<wchar_t>::operator=(this->parameters_ + this->parameters_count_,param);
  }
  else {
    std::
    vector<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
    ::push_back(&this->ext_params_,param);
  }
  this->parameters_count_ = this->parameters_count_ + 1;
  return;
}

Assistant:

void add(formattible_type const &param)
            {
                if(parameters_count_ >= base_params_)
                    ext_params_.push_back(param);
                else 
                    parameters_[parameters_count_] = param;
                parameters_count_++;
            }